

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

string * __thiscall
cmsys::anon_unknown_3::SymbolProperties::GetFileName
          (string *__return_storage_ptr__,SymbolProperties *this,string *path)

{
  string *extraout_RAX;
  string *psVar1;
  long in_RCX;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,path,(long)&(path->_M_dataplus)._M_p + in_RCX);
  psVar1 = extraout_RAX;
  if (this->ReportPath == 0) {
    psVar1 = (string *)std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f);
    if (psVar1 != (string *)0xffffffffffffffff) {
      psVar1 = (string *)std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    }
  }
  return psVar1;
}

Assistant:

std::string SymbolProperties::GetFileName(const std::string& path) const
{
  std::string file(path);
  if (!this->ReportPath) {
    size_t at = file.rfind('/');
    if (at != std::string::npos) {
      file.erase(0, at + 1);
    }
  }
  return file;
}